

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall
SQCompilation::CodegenVisitor::visitIfStatement(CodegenVisitor *this,IfStatement *ifStmt)

{
  SQUnsignedInteger *pSVar1;
  SQInstruction *pSVar2;
  bool bVar3;
  size_type sVar4;
  Node *this_00;
  long n;
  SQInteger SVar5;
  SQObjectPtr *p;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  SQFuncState *pSVar10;
  ulong uVar11;
  SQScope __oldscope__;
  SQObjectPtr local_58;
  SQInteger local_48;
  SQInteger SStack_40;
  
  lVar8 = (long)(ifStmt->super_Statement).super_Node._coordinates.lineStart;
  if (lVar8 != -1) {
    SQFuncState::AddLineInfos(this->_fs,lVar8,this->_lineinfo,false);
  }
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  pSVar10 = this->_fs;
  (this->_scope).outers = pSVar10->_outers;
  SVar5 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar5;
  local_58.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_58.super_SQObject._type = OT_NULL;
  local_58.super_SQObject._flags = '\0';
  local_58.super_SQObject._5_1_ = '\0';
  local_58.super_SQObject._6_1_ = '\0';
  local_58.super_SQObject._7_1_ = '\0';
  uVar9 = (this->_scopedconsts)._allocated;
  uVar7 = (this->_scopedconsts)._size;
  p = (this->_scopedconsts)._vals;
  if (uVar9 <= uVar7) {
    uVar11 = 4;
    if (uVar7 * 2 != 0) {
      uVar11 = (ulong)(uVar7 * 2);
    }
    p = (SQObjectPtr *)
        sq_vm_realloc((this->_scopedconsts)._alloc_ctx,p,(ulong)uVar9 << 4,uVar11 << 4);
    (this->_scopedconsts)._vals = p;
    (this->_scopedconsts)._allocated = (size_type)uVar11;
    uVar7 = (this->_scopedconsts)._size;
  }
  (this->_scopedconsts)._size = uVar7 + 1;
  pSVar2 = (SQInstruction *)(p + uVar7);
  pSVar2->field_0 = (anon_union_4_2_91d81cc7_for_SQInstruction_0)local_58.super_SQObject._type;
  pSVar2->op = local_58.super_SQObject._flags;
  pSVar2->_arg0 = local_58.super_SQObject._5_1_;
  pSVar2->_arg2 = local_58.super_SQObject._6_1_;
  pSVar2->_arg3 = local_58.super_SQObject._7_1_;
  ((SQObjectValue *)(pSVar2 + 1))->pTable = (SQTable *)local_58.super_SQObject._unVal;
  if ((p[uVar7].super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((p[uVar7].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SQObjectPtr::~SQObjectPtr(&local_58);
  this_00 = &ifStmt->_cond->super_Node;
  bVar3 = this->_donot_get;
  this->_donot_get = false;
  Node::visit<SQCompilation::CodegenVisitor>(this_00,this);
  this->_donot_get = bVar3;
  pSVar10 = this->_fs;
  SVar5 = SQFuncState::PopTarget(pSVar10);
  local_58.super_SQObject._5_1_ = (char)SVar5;
  local_58.super_SQObject._0_5_ = 0x2700000000;
  local_58.super_SQObject._0_8_ = (ulong)local_58.super_SQObject._4_2_ << 0x20;
  SQFuncState::AddInstruction(pSVar10,(SQInstruction *)&local_58);
  uVar11 = (ulong)((this->_fs->_instructions)._size - 1);
  Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_thenB->super_Node,this);
  pSVar10 = this->_fs;
  sVar4 = (pSVar10->_instructions)._size;
  if (ifStmt->_elseB == (Statement *)0x0) {
    uVar6 = 0;
  }
  else {
    local_58.super_SQObject._type = 0;
    local_58.super_SQObject._flags = '\"';
    local_58.super_SQObject._5_1_ = '\0';
    local_58.super_SQObject._6_1_ = '\0';
    local_58.super_SQObject._7_1_ = '\0';
    SQFuncState::AddInstruction(pSVar10,(SQInstruction *)&local_58);
    uVar6 = (ulong)((this->_fs->_instructions)._size - 1);
    Node::visit<SQCompilation::CodegenVisitor>(&ifStmt->_elseB->super_Node,this);
    SQFuncState::SetInstructionParam
              (this->_fs,uVar6,1,((this->_fs->_instructions)._size - 1) - uVar6);
    pSVar10 = this->_fs;
    uVar6 = (ulong)(ifStmt->_elseB != (Statement *)0x0);
  }
  SQFuncState::SetInstructionParam(pSVar10,uVar11,1,((sVar4 - 1) - uVar11) + uVar6);
  lVar8 = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  n = (this->_scope).stacksize;
  if (SVar5 != n) {
    SQFuncState::SetStackSize(this->_fs,n);
    if (lVar8 != this->_fs->_outers) {
      local_58.super_SQObject._4_4_ = 0x47;
      local_58.super_SQObject._type =
           *(anon_union_4_2_91d81cc7_for_SQInstruction_0 *)&(this->_scope).stacksize;
      SQFuncState::AddInstruction(this->_fs,(SQInstruction *)&local_58);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  uVar9 = (this->_scopedconsts)._size - 1;
  (this->_scopedconsts)._size = uVar9;
  SQObjectPtr::~SQObjectPtr((this->_scopedconsts)._vals + uVar9);
  return;
}

Assistant:

void CodegenVisitor::visitIfStatement(IfStatement *ifStmt) {
    addLineNumber(ifStmt);
    BEGIN_SCOPE();

    visitForceGet(ifStmt->condition());

    _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
    SQInteger jnepos = _fs->GetCurrentPos();

    ifStmt->thenBranch()->visit(this);

    SQInteger endifblock = _fs->GetCurrentPos();

    if (ifStmt->elseBranch()) {
        _fs->AddInstruction(_OP_JMP);
        SQInteger jmppos = _fs->GetCurrentPos();
        ifStmt->elseBranch()->visit(this);
        _fs->SetInstructionParam(jmppos, 1, _fs->GetCurrentPos() - jmppos);
    }

    _fs->SetInstructionParam(jnepos, 1, endifblock - jnepos + (ifStmt->elseBranch() ? 1 : 0));
    END_SCOPE();
}